

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_begin_newenviron(telnet_t *telnet,uchar cmd)

{
  uchar cmd_local;
  
  telnet_begin_sb(telnet,'\'');
  telnet_send(telnet,(char *)&cmd_local,1);
  return;
}

Assistant:

void telnet_begin_newenviron(telnet_t *telnet, unsigned char cmd) {
	telnet_begin_sb(telnet, TELNET_TELOPT_NEW_ENVIRON);
	telnet_send(telnet, (const char *)&cmd, 1);
}